

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O3

Matrix * MatrixTranslate(Matrix *__return_storage_ptr__,float x,float y,float z)

{
  __return_storage_ptr__->m0 = 1.0;
  __return_storage_ptr__->m4 = 0.0;
  __return_storage_ptr__->m8 = 0.0;
  __return_storage_ptr__->m12 = x;
  __return_storage_ptr__->m1 = 0.0;
  __return_storage_ptr__->m5 = 1.0;
  __return_storage_ptr__->m9 = 0.0;
  __return_storage_ptr__->m13 = y;
  __return_storage_ptr__->m2 = 0.0;
  __return_storage_ptr__->m6 = 0.0;
  __return_storage_ptr__->m10 = 1.0;
  __return_storage_ptr__->m14 = z;
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 1.0;
  return __return_storage_ptr__;
}

Assistant:

RMDEF Matrix MatrixTranslate(float x, float y, float z)
{
    Matrix result = { 1.0f, 0.0f, 0.0f, x,
                      0.0f, 1.0f, 0.0f, y,
                      0.0f, 0.0f, 1.0f, z,
                      0.0f, 0.0f, 0.0f, 1.0f };

    return result;
}